

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O3

qpdf_oh qpdf_oh_get_array_item(qpdf_data qpdf,qpdf_oh oh,int n)

{
  uint uVar1;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<unsigned_int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:883:12)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<unsigned_int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:883:12)>
             ::_M_manager;
  local_48._12_4_ = 0;
  local_48._8_4_ = n;
  local_30 = std::
             _Function_handler<unsigned_int_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1396:61)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<unsigned_int_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1396:61)>
             ::_M_manager;
  local_48._M_unused._M_object = qpdf;
  local_28._M_unused._M_object = qpdf;
  uVar1 = do_with_oh<unsigned_int>
                    (qpdf,oh,(function<unsigned_int_()> *)&local_28,
                     (function<unsigned_int_(QPDFObjectHandle_&)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return uVar1;
}

Assistant:

qpdf_oh
qpdf_oh_get_array_item(qpdf_data qpdf, qpdf_oh oh, int n)
{
    return do_with_oh<qpdf_oh>(qpdf, oh, return_null(qpdf), [qpdf, n](QPDFObjectHandle& o) {
        QTC::TC("qpdf", "qpdf-c called qpdf_oh_get_array_item");
        return new_object(qpdf, o.getArrayItem(n));
    });
}